

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
smf::MidiMessage::intToVlv
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int value)

{
  pointer *ppuVar1;
  iterator iVar2;
  undefined1 uVar3;
  ulong uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  byte bVar7;
  undefined8 in_RAX;
  uchar uVar8;
  uchar byte4;
  uchar byte3;
  uchar byte2;
  uchar byte1;
  uchar byte5;
  undefined8 uStack_18;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = (uchar)value;
  if (value < 0x80) {
    uStack_18._0_7_ = (undefined7)in_RAX;
    uStack_18 = CONCAT17(uVar8,(undefined7)uStack_18);
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (__return_storage_ptr__,iVar2,(uchar *)((long)&uStack_18 + 7));
      return __return_storage_ptr__;
    }
    *iVar2._M_current = uVar8;
  }
  else {
    uStack_18._6_2_ = (undefined2)((ulong)in_RAX >> 0x30);
    uStack_18._0_5_ = (undefined5)in_RAX;
    uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15(uVar8,(undefined5)uStack_18)) & 0xffff7fffffffffff
    ;
    uVar3 = (undefined1)((uint)value >> 7);
    uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14(uVar3,(undefined4)uStack_18)) & 0xffffff7fffffffff
    ;
    uVar5 = (undefined1)((uint)value >> 0xe);
    uStack_18 = CONCAT44(uStack_18._4_4_,CONCAT13(uVar5,(undefined3)uStack_18)) & 0xffffffff7fffffff
    ;
    uVar6 = (undefined1)((uint)value >> 0x15);
    uStack_18 = CONCAT53(uStack_18._3_5_,CONCAT12(uVar6,(undefined2)uStack_18)) & 0xffffffffff7fffff
    ;
    uVar4 = uStack_18;
    bVar7 = (byte)((uint)value >> 0x1c);
    uStack_18._0_7_ = CONCAT16(bVar7,(undefined6)uStack_18);
    if (0xfffffff < (uint)value) {
      uStack_18._0_2_ = (undefined2)uVar4;
      uStack_18 = CONCAT53(uStack_18._3_5_,CONCAT12(uVar6,(undefined2)uStack_18)) | 0x800000;
    }
    if (uStack_18._2_1_ != '\0') {
      uStack_18 = CONCAT44(uStack_18._4_4_,CONCAT13(uVar5,(int3)uStack_18)) | 0x80800000;
    }
    if (uStack_18._3_1_ != '\0') {
      uStack_18 = CONCAT35(uStack_18._5_3_,CONCAT14(uVar3,(int)uStack_18)) | 0x8080000000;
    }
    if (uStack_18._4_1_ != '\0') {
      uStack_18 = uStack_18 | 0x8000000000;
    }
    if (0xfffffff < (uint)value) {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,(uchar *)((long)&uStack_18 + 6));
      }
      else {
        *iVar2._M_current = bVar7;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    if (uStack_18._2_1_ != '\0') {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,(uchar *)((long)&uStack_18 + 2));
      }
      else {
        *iVar2._M_current = uStack_18._2_1_;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    if (uStack_18._3_1_ != '\0') {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,(uchar *)((long)&uStack_18 + 3));
      }
      else {
        *iVar2._M_current = uStack_18._3_1_;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    if (uStack_18._4_1_ != '\0') {
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   iVar2,(uchar *)((long)&uStack_18 + 4));
      }
      else {
        *iVar2._M_current = uStack_18._4_1_;
        ppuVar1 = &(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
    }
    iVar2._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,iVar2
                 ,(uchar *)((long)&uStack_18 + 5));
      return __return_storage_ptr__;
    }
    *iVar2._M_current = uStack_18._5_1_;
  }
  ppuVar1 = &(__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
  return __return_storage_ptr__;
}

Assistant:

std::vector<uchar> MidiMessage::intToVlv(int value) {
	std::vector<uchar> output;
	if (value < 128) {
		output.push_back((uchar)value);
	} else {
		// calculate VLV bytes and insert into message
		uchar byte1 = value & 0x7f;
		uchar byte2 = (value >>  7) & 0x7f;
		uchar byte3 = (value >> 14) & 0x7f;
		uchar byte4 = (value >> 21) & 0x7f;
		uchar byte5 = (value >> 28) & 0x7f;
		if (byte5) {
			byte4 |= 0x80;
		}
		if (byte4) {
			byte4 |= 0x80;
			byte3 |= 0x80;
		}
		if (byte3) {
			byte3 |= 0x80;
			byte2 |= 0x80;
		}
		if (byte2) {
			byte2 |= 0x80;
		}
		if (byte5) { output.push_back(byte5); }
		if (byte4) { output.push_back(byte4); }
		if (byte3) { output.push_back(byte3); }
		if (byte2) { output.push_back(byte2); }
		output.push_back(byte1);
	}

	return output;
}